

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SubroutineSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SubroutineSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation_const&,slang::ast::VariableLifetime,slang::ast::SubroutineKind&>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          VariableLifetime *args_3,SubroutineKind *args_4)

{
  string_view name;
  SubroutineSymbol *pSVar1;
  Compilation *in_RCX;
  SubroutineSymbol *in_RDX;
  SourceLocation in_RSI;
  size_t in_RDI;
  undefined8 in_R8;
  VariableLifetime defaultLifetime;
  char *unaff_retaddr;
  SubroutineKind in_stack_00000010;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  
  defaultLifetime = (VariableLifetime)((ulong)in_R8 >> 0x20);
  pSVar1 = (SubroutineSymbol *)
           allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  name._M_str = unaff_retaddr;
  name._M_len = in_RDI;
  slang::ast::SubroutineSymbol::SubroutineSymbol
            (in_RDX,in_RCX,name,in_RSI,defaultLifetime,in_stack_00000010);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }